

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::UVMapping2D::ToString_abi_cxx11_(UVMapping2D *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,&this->su);
  return in_RDI;
}

Assistant:

std::string UVMapping2D::ToString() const {
    return StringPrintf("[ UVMapping2D su: %f sv: %f du: %f dv: %f ]", su, sv, du, dv);
}